

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

t_namelist * namelist_append(t_namelist *listwas,char *s,int allowdup)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  t_namelist *nl2;
  t_namelist *nl;
  int allowdup_local;
  char *s_local;
  t_namelist *listwas_local;
  
  listwas_local = (t_namelist *)getbytes(0x10);
  listwas_local->nl_next = (_namelist *)0x0;
  sVar2 = strlen(s);
  pcVar3 = (char *)getbytes(sVar2 + 1);
  listwas_local->nl_string = pcVar3;
  strcpy(listwas_local->nl_string,s);
  sys_unbashfilename(listwas_local->nl_string,listwas_local->nl_string);
  nl2 = listwas;
  if (listwas != (t_namelist *)0x0) {
    while( true ) {
      if ((allowdup == 0) && (iVar1 = strcmp(nl2->nl_string,s), iVar1 == 0)) {
        pcVar3 = listwas_local->nl_string;
        sVar2 = strlen(listwas_local->nl_string);
        freebytes(pcVar3,sVar2 + 1);
        return listwas;
      }
      if (nl2->nl_next == (_namelist *)0x0) break;
      nl2 = nl2->nl_next;
    }
    nl2->nl_next = listwas_local;
    listwas_local = listwas;
  }
  return listwas_local;
}

Assistant:

t_namelist *namelist_append(t_namelist *listwas, const char *s, int allowdup)
{
    t_namelist *nl, *nl2;
    nl2 = (t_namelist *)(getbytes(sizeof(*nl)));
    nl2->nl_next = 0;
    nl2->nl_string = (char *)getbytes(strlen(s) + 1);
    strcpy(nl2->nl_string, s);
    sys_unbashfilename(nl2->nl_string, nl2->nl_string);
    if (!listwas)
        return (nl2);
    else
    {
        for (nl = listwas; ;)
        {
            if (!allowdup && !strcmp(nl->nl_string, s))
            {
                freebytes(nl2->nl_string, strlen(nl2->nl_string) + 1);
                return (listwas);
            }
            if (!nl->nl_next)
                break;
            nl = nl->nl_next;
        }
        nl->nl_next = nl2;
    }
    return (listwas);
}